

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  long *plVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  pointer *__ptr;
  char *pcVar11;
  iterator converter;
  string format;
  ProtocolReader reader;
  string out_file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  formats;
  string map_files;
  string source;
  string output_path;
  CommandLineParser parser;
  KlassRegister klass_register;
  long *local_5c8;
  long *local_5c0;
  _Base_ptr local_5b8;
  ulong *local_5b0;
  undefined8 local_5a8;
  ulong local_5a0;
  undefined4 uStack_598;
  undefined4 uStack_594;
  uint *local_590;
  undefined8 local_588;
  uint local_580 [2];
  undefined4 uStack_578;
  undefined4 uStack_574;
  uint *local_570;
  undefined8 local_568;
  uint local_560 [2];
  undefined4 uStack_558;
  undefined4 uStack_554;
  uint *local_550;
  undefined8 local_548;
  uint local_540 [2];
  undefined4 uStack_538;
  undefined4 uStack_534;
  uint *local_530;
  undefined8 local_528;
  uint local_520 [2];
  undefined4 uStack_518;
  undefined4 uStack_514;
  key_type local_510;
  string local_4f0 [4];
  string local_458;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  local_438;
  _Base_ptr *local_408;
  undefined8 local_400;
  code *local_3f8;
  code *local_3f0;
  string local_3e8;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  string local_3a8;
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  uint *local_268;
  undefined8 local_260;
  uint local_258 [2];
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined2 local_248;
  uint *local_240;
  undefined8 local_238;
  uint local_230 [2];
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined2 local_220;
  uint *local_218;
  undefined8 local_210;
  uint local_208 [2];
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined2 local_1f8;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0 [2];
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined2 local_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined2 local_1a8;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  char *local_180 [2];
  char local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  CommandLineParser local_140 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_108 [56];
  undefined1 *local_d0;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined1 local_a0 [16];
  KlassRegister local_90 [40];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68 [56];
  
  local_438._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_438._M_impl.super__Rb_tree_header._M_header;
  local_438._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_438._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_438._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438._M_impl.super__Rb_tree_header._M_header._M_right =
       local_438._M_impl.super__Rb_tree_header._M_header._M_left;
  init_supported_formats
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
              *)&local_438);
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"--","");
  std::__cxx11::string::string((string *)local_160,*argv,(allocator *)local_4f0);
  HawkTracer::ClientUtils::CommandLineParser::CommandLineParser(local_140,local_288,local_160);
  if (local_160[0] != local_150) {
    operator_delete(local_160[0]);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0]);
  }
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"format","");
  supported_formats(local_4f0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                     *)&local_438);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_4f0,0,(char *)0x0,0x113020);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_5a0 = *puVar8;
    uStack_598 = (undefined4)plVar5[3];
    uStack_594 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_5b0 = &local_5a0;
  }
  else {
    local_5a0 = *puVar8;
    local_5b0 = (ulong *)*plVar5;
  }
  local_1c0 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_5b0 == &local_5a0) {
    uStack_1b0 = uStack_598;
    uStack_1ac = uStack_594;
    local_1c8 = &local_1b8;
  }
  else {
    local_1c8 = local_5b0;
  }
  local_1b8 = local_5a0;
  local_5a8 = 0;
  local_5a0 = local_5a0 & 0xffffffffffffff00;
  local_1a8 = 0;
  local_5b0 = &local_5a0;
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_140,local_2a8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0);
  }
  paVar1 = &local_4f0[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f0[0]._M_dataplus._M_p);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0]);
  }
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"output","");
  local_530 = local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"Output file","");
  if (local_530 == local_520) {
    uStack_1d8 = uStack_518;
    uStack_1d4 = uStack_514;
    local_1f0 = local_1e0;
  }
  else {
    local_1f0 = local_530;
  }
  local_1e8 = local_528;
  local_528 = 0;
  local_520[0] = local_520[0] & 0xffffff00;
  local_1d0 = 0;
  local_530 = local_520;
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_140,local_2c8);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_530 != local_520) {
    operator_delete(local_530);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0]);
  }
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"source","");
  local_550 = local_540;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_550,"Data source description (either filename, or server address)","")
  ;
  if (local_550 == local_540) {
    uStack_200 = uStack_538;
    uStack_1fc = uStack_534;
    local_218 = local_208;
  }
  else {
    local_218 = local_550;
  }
  local_210 = local_548;
  local_548 = 0;
  local_540[0] = local_540[0] & 0xffffff00;
  local_1f8 = 0x100;
  local_550 = local_540;
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_140,local_2e8);
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_550 != local_540) {
    operator_delete(local_550);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0]);
  }
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"map","");
  local_570 = local_560;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_570,"Comma-separated list of map files","");
  if (local_570 == local_560) {
    uStack_228 = uStack_558;
    uStack_224 = uStack_554;
    local_240 = local_230;
  }
  else {
    local_240 = local_570;
  }
  local_238 = local_568;
  local_568 = 0;
  local_560[0] = local_560[0] & 0xffffff00;
  local_220 = 0;
  local_570 = local_560;
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_140,local_308);
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if (local_570 != local_560) {
    operator_delete(local_570);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0]);
  }
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"help","");
  local_590 = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"Print this help","");
  if (local_590 == local_580) {
    uStack_250 = uStack_578;
    uStack_24c = uStack_574;
    local_268 = local_258;
  }
  else {
    local_268 = local_590;
  }
  local_260 = local_588;
  local_588 = 0;
  local_580[0] = local_580[0] & 0xffffff00;
  local_248 = 1;
  local_590 = local_580;
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_140,local_328);
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  if (local_590 != local_580) {
    operator_delete(local_590);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0]);
  }
  cVar2 = HawkTracer::ClientUtils::CommandLineParser::parse
                    ((int)local_140,(char **)(ulong)(uint)argc);
  if (cVar2 != '\0') {
    local_4f0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"help","");
    cVar2 = HawkTracer::ClientUtils::CommandLineParser::has_value((string *)local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_4f0[0]._M_dataplus._M_p);
    }
    if (cVar2 == '\0') {
      local_4f0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"format","");
      local_348[0] = local_338;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"chrome-tracing","");
      HawkTracer::ClientUtils::CommandLineParser::get_value
                (&local_510,local_140,local_4f0,local_348);
      if (local_348[0] != local_338) {
        operator_delete(local_348[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_4f0[0]._M_dataplus._M_p);
      }
      local_4f0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"output","");
      local_368[0] = local_358;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_368,"hawktracer-trace-%d-%m-%Y-%H_%M_%S.httrace","");
      HawkTracer::ClientUtils::CommandLineParser::get_value(local_180,local_140,local_4f0,local_368)
      ;
      if (local_368[0] != local_358) {
        operator_delete(local_368[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_4f0[0]._M_dataplus._M_p);
      }
      local_4f0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"source","");
      local_388[0] = local_378;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"");
      HawkTracer::ClientUtils::CommandLineParser::get_value(local_1a0,local_140,local_4f0,local_388)
      ;
      if (local_388[0] != local_378) {
        operator_delete(local_388[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_4f0[0]._M_dataplus._M_p);
      }
      local_4f0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"map","");
      local_3c8[0] = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
      HawkTracer::ClientUtils::CommandLineParser::get_value
                (&local_3a8,local_140,local_4f0,local_3c8);
      if (local_3c8[0] != local_3b8) {
        operator_delete(local_3c8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_4f0[0]._M_dataplus._M_p);
      }
      HawkTracer::ClientUtils::make_stream_from_string((string *)&local_5c8);
      if (local_5c8 == (long *)0x0) {
        iVar10 = 1;
      }
      else {
        cVar2 = (**(code **)(*local_5c8 + 0x30))();
        HawkTracer::parser::KlassRegister::KlassRegister(local_90);
        local_5c0 = local_5c8;
        local_5c8 = (long *)0x0;
        HawkTracer::parser::ProtocolReader::ProtocolReader
                  ((ProtocolReader *)local_4f0,local_90,&local_5c0,1);
        if (local_5c0 != (long *)0x0) {
          (**(code **)(*local_5c0 + 8))();
        }
        local_5c0 = (long *)0x0;
        create_output_path_abi_cxx11_(&local_458,local_180[0]);
        local_5b8 = (_Base_ptr)
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                    ::find(&local_438,&local_510);
        if ((_Rb_tree_header *)local_5b8 == &local_438._M_impl.super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown format: ",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_510._M_dataplus._M_p,
                              local_510._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,". Supported formats are: ",0x19);
          supported_formats(&local_3e8,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                             *)&local_438);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          iVar10 = 1;
        }
        else {
          cVar3 = (**(code **)(**(long **)(local_5b8 + 2) + 0x10))
                            (*(long **)(local_5b8 + 2),&local_458);
          if (cVar3 == '\0') {
            lVar9 = 0x16;
            pcVar11 = "Can\'t open output file";
          }
          else {
            local_400 = 0;
            local_408 = &local_5b8;
            local_3f0 = std::
                        _Function_handler<void_(const_HawkTracer::parser::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/client/main.cpp:86:41)>
                        ::_M_invoke;
            local_3f8 = std::
                        _Function_handler<void_(const_HawkTracer::parser::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/client/main.cpp:86:41)>
                        ::_M_manager;
            HawkTracer::parser::ProtocolReader::register_events_listener(local_4f0);
            if (local_3f8 != (code *)0x0) {
              (*local_3f8)(&local_408,&local_408,3);
            }
            if (local_3a8._M_string_length == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "map not specified... profiler will use numbers instead of human-readable names"
                         ,0x4e);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
              std::ostream::put('\0');
              std::ostream::flush();
            }
            else {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                                     *)&local_438,&local_510);
              bVar4 = HawkTracer::client::Converter::set_tracepoint_map
                                ((pmVar6->_M_t).
                                 super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
                                 .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>.
                                 _M_head_impl,&local_3a8);
              if (!bVar4) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Map could not be set",0x14);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Output will be written to a file: ",0x22);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_458._M_dataplus._M_p,
                                local_458._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            cVar3 = HawkTracer::parser::ProtocolReader::start();
            if (cVar3 != '\0') {
              if (cVar2 == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Processing the file...",0x16);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Hit [Enter] to finish the trace...",0x22);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                getchar();
                HawkTracer::parser::ProtocolReader::stop();
              }
              HawkTracer::parser::ProtocolReader::wait_for_complete();
              HawkTracer::parser::ProtocolReader::stop();
              iVar10 = 0;
              (**(code **)(**(long **)(local_5b8 + 2) + 0x20))();
              goto LAB_0010c6f4;
            }
            lVar9 = 0x1f;
            pcVar11 = "Error on starting the reader!!!";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
          std::ostream::put('\0');
          iVar10 = 1;
          std::ostream::flush();
        }
LAB_0010c6f4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p);
        }
        HawkTracer::parser::ProtocolReader::~ProtocolReader((ProtocolReader *)local_4f0);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(local_68);
        if (local_5c8 != (long *)0x0) {
          (**(code **)(*local_5c8 + 8))();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (local_180[0] != local_170) {
        operator_delete(local_180[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p);
      }
      goto LAB_0010c05d;
    }
  }
  iVar10 = 1;
  HawkTracer::ClientUtils::CommandLineParser::print_help((ostream *)local_140);
LAB_0010c05d:
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_108);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  ::~_Rb_tree(&local_438);
  return iVar10;
}

Assistant:

int main(int argc, char** argv)
{
    std::map<std::string, std::unique_ptr<client::Converter>> formats;

    init_supported_formats(formats);

    CommandLineParser parser("--", argv[0]);
    parser.register_option("format", CommandLineParser::OptionInfo(false, false, "Output format. Supported formats: " + supported_formats(formats)));
    parser.register_option("output", CommandLineParser::OptionInfo(false, false, "Output file"));
    parser.register_option("source", CommandLineParser::OptionInfo(false, true, "Data source description (either filename, or server address)"));
    parser.register_option("map", CommandLineParser::OptionInfo(false, false, "Comma-separated list of map files"));
    parser.register_option("help", CommandLineParser::OptionInfo(true, false, "Print this help"));

    if (!parser.parse(argc, argv) || parser.has_value("help"))
    {
        parser.print_help(std::cerr);
        return 1;
    }

    std::string format = parser.get_value("format", "chrome-tracing");
    std::string output_path = parser.get_value("output", "hawktracer-trace-%d-%m-%Y-%H_%M_%S.httrace");
    std::string source = parser.get_value("source", "");
    std::string map_files = parser.get_value("map", "");

    std::unique_ptr<parser::Stream> stream = ClientUtils::make_stream_from_string(source);
    if (!stream)
    {
        return 1;
    }

    bool is_stream_continuous = stream->is_continuous();

    parser::KlassRegister klass_register;
    parser::ProtocolReader reader(&klass_register, std::move(stream), true);
    std::string out_file = create_output_path(output_path.c_str());

    auto converter = formats.find(format);
    if (converter == formats.end())
    {
        std::cerr << "Unknown format: " << format << ". Supported formats are: " << supported_formats(formats) << std::endl;
        return 1;
    }
    if (converter->second->init(out_file))
    {
        reader.register_events_listener([&converter] (const parser::Event& event) { converter->second->process_event(event); });
    }
    else
    {
        std::cerr << "Can't open output file" << std::endl;
        return 1;
    }

    if (map_files.empty())
    {
        std::cerr << "map not specified... profiler will use numbers instead of human-readable names" << std::endl;
    }
    else
    {
        bool map_set = formats[format]->set_tracepoint_map(map_files);
        if (!map_set)
        {
            std::cerr << "Map could not be set" << std::endl;
        }
    }

    std::cout << "Output will be written to a file: " << out_file << std::endl;

    if (!reader.start())
    {
        std::cerr << "Error on starting the reader!!!" << std::endl;
        return 1;
    }

    if (is_stream_continuous)
    {
        std::cout << "Hit [Enter] to finish the trace..." << std::endl;
        getchar();
        reader.stop();
    }
    else
    {
        std::cout << "Processing the file..." << std::endl;
    }

    reader.wait_for_complete();
    reader.stop();
    converter->second->stop();

    return 0;
}